

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# announce_entry.hpp
# Opt level: O0

announce_endpoint * __thiscall
libtorrent::aux::announce_endpoint::operator=(announce_endpoint *this,announce_endpoint *param_1)

{
  announce_endpoint *param_1_local;
  announce_endpoint *this_local;
  
  boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::operator=
            (&this->local_endpoint,&param_1->local_endpoint);
  container_wrapper<libtorrent::aux::announce_infohash,_libtorrent::protocol_version,_std::array<libtorrent::aux::announce_infohash,_2UL>_>
  ::operator=(&this->info_hashes,&param_1->info_hashes);
  this->field_0xb0 = this->field_0xb0 & 0xfe | param_1->field_0xb0 & 1;
  listen_socket_handle::operator=(&this->socket,&param_1->socket);
  return this;
}

Assistant:

struct TORRENT_EXTRA_EXPORT announce_endpoint
	{
		// internal
		announce_endpoint(aux::listen_socket_handle const& s, bool completed);

		// the local endpoint of the listen interface associated with this endpoint
		tcp::endpoint local_endpoint;

		// torrents can be announced using multiple info hashes
		// for different protocol versions

		// info_hashes[0] is the v1 info hash (SHA1)
		// info_hashes[1] is the v2 info hash (truncated SHA-256)
		aux::array<announce_infohash, num_protocols, protocol_version> info_hashes;

		// reset announce counters and clears the started sent flag.
		// The announce_endpoint will look like we've never talked to
		// the tracker.
		void reset();

		// set to false to not announce from this endpoint
		bool enabled : 1;

		// internal
		aux::listen_socket_handle socket;
	}